

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  int iVar4;
  stbi_uc *psVar5;
  stbi_uc *psVar6;
  stbi_uc *psVar7;
  stbi_uc sVar8;
  byte bVar9;
  byte bVar10;
  
  iVar3 = stbi__pic_is4(s,anon_var_dwarf_76da1);
  if (iVar3 == 0) goto LAB_0013200f;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar5 = s->img_buffer;
LAB_00131f8f:
    s->img_buffer = psVar5 + 0x58;
  }
  else {
    psVar5 = s->img_buffer;
    iVar3 = (int)s->img_buffer_end - (int)psVar5;
    if (0x57 < iVar3) goto LAB_00131f8f;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar3);
  }
  iVar3 = stbi__get16be(s);
  if (x != (int *)0x0) {
    *x = iVar3;
  }
  iVar4 = stbi__get16be(s);
  if (y != (int *)0x0) {
    *y = iVar4;
    iVar4 = iVar3;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00131fdb:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_0013200f;
  }
  else {
    iVar3 = (*(s->io).eof)(s->io_user_data);
    if (iVar3 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_0013200f;
      goto LAB_00131fdb;
    }
  }
  iVar3 = iVar4;
  if (x != (int *)0x0) {
    iVar3 = *x;
  }
  if (iVar3 != 0) {
    if (y != (int *)0x0) {
      iVar4 = *y;
    }
    if ((int)(0x10000000 / (long)iVar3) < iVar4) {
LAB_0013200f:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar5 = s->img_buffer;
  }
  else {
    psVar5 = s->img_buffer;
    iVar3 = (int)s->img_buffer_end - (int)psVar5;
    if (iVar3 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar3);
      goto LAB_0013207d;
    }
  }
  s->img_buffer = psVar5 + 8;
LAB_0013207d:
  psVar5 = s->buffer_start;
  psVar1 = s->buffer_start + 1;
  iVar3 = 0xb;
  bVar9 = 0;
  do {
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      return 0;
    }
    psVar7 = s->img_buffer;
    psVar6 = s->img_buffer_end;
    if (psVar7 < psVar6) {
      s->img_buffer = psVar7 + 1;
      sVar2 = *psVar7;
      psVar7 = psVar7 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      sVar2 = '\0';
    }
    else {
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar2 = '\0';
        psVar6 = psVar1;
      }
      else {
        sVar2 = *psVar5;
        psVar6 = psVar5 + iVar4;
      }
      s->img_buffer_end = psVar6;
      s->img_buffer = psVar1;
      psVar7 = psVar1;
    }
    if (psVar7 < psVar6) {
      s->img_buffer = psVar7 + 1;
      sVar8 = *psVar7;
      psVar7 = psVar7 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      sVar8 = '\0';
    }
    else {
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        sVar8 = '\0';
        psVar6 = psVar1;
      }
      else {
        sVar8 = *psVar5;
        psVar6 = psVar5 + iVar4;
      }
      s->img_buffer_end = psVar6;
      s->img_buffer = psVar1;
      psVar7 = psVar1;
    }
    if (psVar7 < psVar6) {
      psVar7 = psVar7 + 1;
LAB_001321c2:
      s->img_buffer = psVar7;
    }
    else if (s->read_from_callbacks != 0) {
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        psVar6 = psVar1;
      }
      else {
        psVar6 = psVar5 + iVar4;
      }
      s->img_buffer_end = psVar6;
      psVar7 = psVar1;
      goto LAB_001321c2;
    }
    if (psVar7 < psVar6) {
      s->img_buffer = psVar7 + 1;
      bVar10 = *psVar7;
      psVar7 = psVar7 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar10 = 0;
    }
    else {
      iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      if (iVar4 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar10 = 0;
        psVar6 = psVar1;
      }
      else {
        bVar10 = *psVar5;
        psVar6 = psVar5 + iVar4;
      }
      s->img_buffer_end = psVar6;
      s->img_buffer = psVar1;
      psVar7 = psVar1;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013225a:
      if (psVar6 <= psVar7) goto LAB_0013200f;
    }
    else {
      iVar4 = (*(s->io).eof)(s->io_user_data);
      if (iVar4 != 0) {
        if (s->read_from_callbacks != 0) {
          psVar7 = s->img_buffer;
          psVar6 = s->img_buffer_end;
          goto LAB_0013225a;
        }
        goto LAB_0013200f;
      }
    }
    if (sVar8 != '\b') goto LAB_0013200f;
    bVar9 = bVar9 | bVar10;
    if (sVar2 == '\0') {
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar9 & 0x10) == 0);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained,dummy;
   stbi__pic_packet packets[10];

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}